

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

bool vkt::SpirVAssembly::anon_unknown_5::compareFUnord
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *inputs,vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                        *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *log)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  BufferInterface *pBVar5;
  undefined4 extraout_var;
  const_reference this;
  Allocation *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  MessageBuilder *pMVar6;
  MessageBuilder local_1e8;
  ulong local_68;
  size_t idx;
  long lStack_58;
  bool returnValue;
  float *input2AsFloat;
  float *input1AsFloat;
  deInt32 *outputAsInt;
  deInt32 *expectedOutputAsInt;
  BufferSp *expectedOutput;
  TestLog *log_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *expectedOutputs_local;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  *outputAllocs_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *inputs_local;
  
  expectedOutput = (BufferSp *)log;
  log_local = (TestLog *)expectedOutputs;
  expectedOutputs_local =
       (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
        *)outputAllocs;
  outputAllocs_local =
       (vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_> *)
       inputs;
  sVar3 = std::
          vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
          size(outputAllocs);
  if (sVar3 == 1) {
    expectedOutputAsInt =
         (deInt32 *)
         std::
         vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
         ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                       *)log_local,0);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                           *)log_local,0);
    pBVar5 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(pvVar4);
    iVar2 = (*pBVar5->_vptr_BufferInterface[3])();
    outputAsInt = (deInt32 *)CONCAT44(extraout_var,iVar2);
    this = std::
           vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
           operator[]((vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                       *)expectedOutputs_local,0);
    this_00 = de::SharedPtr<vk::Allocation>::operator->(this);
    input1AsFloat = (float *)::vk::Allocation::getHostPtr(this_00);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                           *)outputAllocs_local,0);
    pBVar5 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(pvVar4);
    iVar2 = (*pBVar5->_vptr_BufferInterface[3])();
    input2AsFloat = (float *)CONCAT44(extraout_var_00,iVar2);
    pvVar4 = std::
             vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
             ::operator[]((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                           *)outputAllocs_local,1);
    pBVar5 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(pvVar4);
    iVar2 = (*pBVar5->_vptr_BufferInterface[3])();
    lStack_58 = CONCAT44(extraout_var_01,iVar2);
    idx._7_1_ = 1;
    local_68 = 0;
    while( true ) {
      uVar1 = local_68;
      pBVar5 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->
                         ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)expectedOutputAsInt);
      iVar2 = (*pBVar5->_vptr_BufferInterface[2])();
      if (CONCAT44(extraout_var_02,iVar2) >> 2 <= uVar1) break;
      if (input1AsFloat[local_68] != (float)outputAsInt[local_68]) {
        tcu::TestLog::operator<<
                  (&local_1e8,(TestLog *)expectedOutput,(BeginMessageToken *)&tcu::TestLog::Message)
        ;
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1e8,(char (*) [33])"ERROR: Sub-case failed. inputs: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,input2AsFloat + local_68);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x1326a33);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(float *)(lStack_58 + local_68 * 4));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])0x12ee84d);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)(input1AsFloat + local_68));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])" expected output: ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,outputAsInt + local_68);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e8);
        idx._7_1_ = 0;
      }
      local_68 = local_68 + 1;
    }
    inputs_local._7_1_ = (bool)(idx._7_1_ & 1);
  }
  else {
    inputs_local._7_1_ = false;
  }
  return inputs_local._7_1_;
}

Assistant:

bool compareFUnord (const std::vector<BufferSp>& inputs, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog& log)
{
	if (outputAllocs.size() != 1)
		return false;

	const BufferSp&	expectedOutput			= expectedOutputs[0];
	const deInt32*	expectedOutputAsInt		= static_cast<const deInt32*>(expectedOutputs[0]->data());
	const deInt32*	outputAsInt				= static_cast<const deInt32*>(outputAllocs[0]->getHostPtr());
	const float*	input1AsFloat			= static_cast<const float*>(inputs[0]->data());
	const float*	input2AsFloat			= static_cast<const float*>(inputs[1]->data());
	bool returnValue						= true;

	for (size_t idx = 0; idx < expectedOutput->getNumBytes() / sizeof(deInt32); ++idx)
	{
		if (outputAsInt[idx] != expectedOutputAsInt[idx])
		{
			log << TestLog::Message << "ERROR: Sub-case failed. inputs: " << input1AsFloat[idx] << "," << input2AsFloat[idx] << " output: " << outputAsInt[idx]<< " expected output: " << expectedOutputAsInt[idx] << TestLog::EndMessage;
			returnValue = false;
		}
	}
	return returnValue;
}